

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die_deliv.c
# Opt level: O2

void report_local_unit_type_error(Dwarf_Debug dbg,int unit_type,char *msg,Dwarf_Error *error)

{
  char *msg_00;
  dwarfstring m;
  dwarfstring_s dStack_48;
  
  if (error != (Dwarf_Error *)0x0) {
    dwarfstring_constructor(&dStack_48);
    dwarfstring_append_printf_s(&dStack_48,"DW_DLE_CU_UT_TYPE_VALUE: %s ",msg);
    dwarfstring_append_printf_u
              (&dStack_48,
               "the compilation unit unit_type is 0x%x, which is unknown to libdwarf. Corrupt DWARF."
               ,(ulong)(uint)unit_type);
    msg_00 = dwarfstring_string(&dStack_48);
    _dwarf_error_string(dbg,error,0x1c6,msg_00);
    dwarfstring_destructor(&dStack_48);
  }
  return;
}

Assistant:

static void
report_local_unit_type_error(Dwarf_Debug dbg,
    int unit_type,
    const char *msg,
    Dwarf_Error *error)
{
    dwarfstring m;

    if (!error) {
        return;
    }
    dwarfstring_constructor(&m);
    dwarfstring_append_printf_s(&m,
        "DW_DLE_CU_UT_TYPE_VALUE: %s ",(char *)msg);
    dwarfstring_append_printf_u(&m,
        "the compilation unit unit_type is 0x%x,"
        " which is unknown to libdwarf. Corrupt DWARF.",
        unit_type);
    _dwarf_error_string(dbg,error,DW_DLE_CU_UT_TYPE_VALUE,
        dwarfstring_string(&m));
    dwarfstring_destructor(&m);
}